

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O0

void __thiscall
ritobin::io::text_write_impl::BinTextWriter::write_item(BinTextWriter *this,Field *item)

{
  Field *item_local;
  BinTextWriter *this_local;
  
  TextWriter::pad(&this->writer);
  TextWriter::write_name(&this->writer,&item->key);
  TextWriter::write_raw<3ul>(&this->writer,(char (*) [3])0x1d79f8);
  write_type(this,&item->value);
  TextWriter::write_raw<4ul>(&this->writer,(char (*) [4])" = ");
  write_value(this,&item->value);
  TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x1d9c21);
  return;
}

Assistant:

void write_item(Field const& item) {
            writer.pad();
            writer.write_name(item.key);
            writer.write_raw(": ");
            write_type(item.value);
            writer.write_raw(" = ");
            write_value(item.value);
            writer.write_raw("\n");
        }